

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

BVec4 __thiscall tcu::getTextureFormatChannelMask(tcu *this,TextureFormat *format)

{
  TextureSwizzle *pTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  pTVar1 = getChannelReadSwizzle(format->order);
  auVar2._0_4_ = -(uint)(-0x7ffffffd < (int)(pTVar1->components[0] ^ 0x80000000));
  auVar2._4_4_ = -(uint)(-0x7ffffffd < (int)(pTVar1->components[1] ^ 0x80000000));
  auVar2._8_4_ = -(uint)(-0x7ffffffd < (int)(pTVar1->components[2] ^ 0x80000000));
  auVar2._12_4_ = -(uint)(-0x7ffffffd < (int)(pTVar1->components[3] ^ 0x80000000));
  auVar2 = packssdw(auVar2,auVar2);
  auVar3._8_4_ = 0xffffffff;
  auVar3._0_8_ = 0xffffffffffffffff;
  auVar3._12_4_ = 0xffffffff;
  auVar2 = packsswb(auVar3 ^ auVar2,auVar3 ^ auVar2);
  *(uint *)this = auVar2._0_4_ & (uint)DAT_001733a0;
  return (BVec4)SUB84(this,0);
}

Assistant:

BVec4 getTextureFormatChannelMask (const TextureFormat& format)
{
	const TextureSwizzle::Channel* const map = getChannelReadSwizzle(format.order).components;
	return BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
}